

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O1

void helicsFederateInfoSetIntegerProperty
               (HelicsFederateInfo fedInfo,int integerProperty,int propertyValue,HelicsError *err)

{
  HelicsFederateInfo pvVar1;
  bool bVar2;
  int local_8;
  int local_4;
  
  if ((err == (HelicsError *)0x0) || (err->error_code == 0)) {
    if (fedInfo == (HelicsFederateInfo)0x0) {
      if (err == (HelicsError *)0x0) goto LAB_001a10f2;
    }
    else {
      bVar2 = *(int *)((long)fedInfo + 0x48) == 0x6bfbbce1;
      pvVar1 = (HelicsFederateInfo)0x0;
      if (bVar2) {
        pvVar1 = fedInfo;
      }
      if (bVar2 || err == (HelicsError *)0x0) goto LAB_001a10f4;
    }
    err->error_code = -3;
    err->message = "helics Federate info object was not valid";
  }
LAB_001a10f2:
  pvVar1 = (HelicsFederateInfo)0x0;
LAB_001a10f4:
  if (pvVar1 != (HelicsFederateInfo)0x0) {
    _local_8 = CONCAT44(integerProperty,propertyValue);
    std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::emplace_back<int&,int&>
              ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
               ((long)pvVar1 + 0x18),&local_4,&local_8);
  }
  return;
}

Assistant:

void helicsFederateInfoSetIntegerProperty(HelicsFederateInfo fedInfo, int integerProperty, int propertyValue, HelicsError* err)
{
    auto* info = getFedInfo(fedInfo, err);
    if (info == nullptr) {
        return;
    }
    info->setProperty(integerProperty, propertyValue);
}